

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void IntegrateFrequencyTable
               (BSDF *bsdf,Vector3f *wo,int sampleCount,int thetaRes,int phiRes,Float *target)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  Float FVar4;
  _Any_data local_68;
  code *pcStack_58;
  code *pcStack_50;
  ulong local_40;
  BSDF *local_38;
  
  uVar3 = 0;
  local_38 = bsdf;
  memset(target,0,(long)(phiRes * thetaRes) << 2);
  if (0 < thetaRes) {
    do {
      local_40 = uVar3;
      if (0 < phiRes) {
        iVar1 = 0;
        do {
          local_68._M_unused._M_object = &local_38;
          pcStack_50 = std::
                       _Function_handler<float_(float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:228:21)>
                       ::_M_invoke;
          pcStack_58 = std::
                       _Function_handler<float_(float,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:228:21)>
                       ::_M_manager;
          local_68._8_8_ = wo;
          FVar4 = AdaptiveSimpson2D((function<float_(float,_float)> *)&local_68,
                                    (3.1415927 / (float)thetaRes) * (float)(int)uVar3,
                                    (6.2831855 / (float)phiRes) * (float)iVar1,
                                    (3.1415927 / (float)thetaRes) * (float)((int)uVar3 + 1),
                                    (6.2831855 / (float)phiRes) * (float)(iVar1 + 1),1e-06,6);
          *target = FVar4 * (float)sampleCount;
          if (pcStack_58 != (code *)0x0) {
            (*pcStack_58)(&local_68,&local_68,__destroy_functor);
          }
          target = target + 1;
          iVar1 = iVar1 + 1;
        } while (phiRes != iVar1);
      }
      uVar2 = (int)local_40 + 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != thetaRes);
  }
  return;
}

Assistant:

void IntegrateFrequencyTable(const BSDF* bsdf, const Vector3f& wo, int sampleCount,
                             int thetaRes, int phiRes, Float* target) {
    memset(target, 0, thetaRes * phiRes * sizeof(Float));

    Float factorTheta = Pi / thetaRes, factorPhi = (2 * Pi) / phiRes;

    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            *target++ =
                sampleCount *
                AdaptiveSimpson2D(
                    [&](Float theta, Float phi) -> Float {
                        Float cosTheta = std::cos(theta), sinTheta = std::sin(theta);
                        Float cosPhi = std::cos(phi), sinPhi = std::sin(phi);
                        Vector3f wiL(sinTheta * cosPhi, sinTheta * sinPhi, cosTheta);
                        return bsdf->PDF(wo, bsdf->LocalToRender(wiL)) * sinTheta;
                    },
                    i* factorTheta, j* factorPhi, (i + 1) * factorTheta,
                    (j + 1) * factorPhi);
        }
    }
}